

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.c
# Opt level: O1

_Bool save_png_image_to_file(FILE *fp,image *image)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  void *__ptr;
  int iVar6;
  __jmp_buf_tag *__env;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  png_structp png_ptr;
  png_infop info_ptr;
  void *local_50;
  size_t local_48;
  void *local_40;
  long local_38;
  
  if (1 < image->channel_count - 3) {
    __assert_fail("is_rgb_or_rgba_image(image)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/io/png_image.c"
                  ,0x74,"_Bool save_png_image_to_file(FILE *, const struct image *)");
  }
  png_ptr = (png_structp)png_create_write_struct("1.6.37",0,0);
  if (png_ptr == (png_structp)0x0) {
    return false;
  }
  info_ptr = (png_infop)png_create_info_struct(png_ptr);
  if (info_ptr == (png_infop)0x0) {
    png_destroy_read_struct(&png_ptr,0);
    return false;
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png_ptr,longjmp,200);
  iVar6 = _setjmp(__env);
  if (iVar6 != 0) {
    png_destroy_write_struct(&png_ptr,&info_ptr);
    return false;
  }
  png_init_io(png_ptr,fp);
  png_set_IHDR(png_ptr,info_ptr,(int)image->width,(int)image->height,8,
               (image->channel_count != 3) * '\x04' + '\x02',0,0,0);
  png_write_info(png_ptr,info_ptr);
  uVar1 = image->channel_count;
  sVar2 = image->width;
  local_48 = image->height;
  local_40 = (void *)0x0;
  if ((local_48 * 8 != 0) && (local_40 = malloc(local_48 * 8), local_40 == (void *)0x0)) {
    save_png_image_to_file_cold_1();
    local_40 = (void *)0x0;
  }
  lVar11 = sVar2 * uVar1;
  if (lVar11 * local_48 != 0) {
    local_50 = malloc(lVar11 * local_48);
    if (local_50 != (void *)0x0) goto LAB_001080af;
    save_png_image_to_file_cold_2();
  }
  local_50 = (void *)0x0;
LAB_001080af:
  __ptr = local_40;
  if (local_48 != 0) {
    puVar13 = (undefined1 *)((long)local_50 + 2);
    local_38 = sVar2 * 4;
    lVar10 = (long)local_50 + 3;
    sVar12 = 0;
    sVar9 = sVar12;
    do {
      *(void **)((long)local_40 + sVar9 * 8) = (void *)(sVar9 * lVar11 + (long)local_50);
      if (uVar1 < 4) {
        if (sVar2 != 0) {
          if (uVar1 != 3) {
            __assert_fail("x < image->width && y < image->height && image->channel_count >= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/scene/image.h"
                          ,0x3e,"struct rgb get_rgb_pixel(const struct image *, size_t, size_t)");
          }
          sVar3 = image[1].channel_count;
          sVar4 = image[1].height;
          sVar5 = image[1].width;
          sVar8 = 0;
          puVar14 = puVar13;
          do {
            fVar15 = *(float *)(sVar5 + sVar12 + sVar8 * 4);
            fVar16 = *(float *)(sVar4 + sVar12 + sVar8 * 4);
            fVar17 = *(float *)(sVar3 + sVar12 + sVar8 * 4);
            if (fVar15 <= 0.0) {
              fVar15 = 0.0;
            }
            if (1.0 <= fVar15) {
              fVar15 = 1.0;
            }
            if (fVar16 <= 0.0) {
              fVar16 = 0.0;
            }
            if (1.0 <= fVar16) {
              fVar16 = 1.0;
            }
            puVar14[-2] = (char)(int)(fVar15 * 255.0);
            puVar14[-1] = (char)(int)(fVar16 * 255.0);
            if (fVar17 <= 0.0) {
              fVar17 = 0.0;
            }
            if (1.0 <= fVar17) {
              fVar17 = 1.0;
            }
            *puVar14 = (char)(int)(fVar17 * 255.0);
            sVar8 = sVar8 + 1;
            puVar14 = puVar14 + 3;
          } while (sVar2 != sVar8);
        }
      }
      else if (sVar2 != 0) {
        sVar3 = image[2].width;
        sVar4 = image[1].channel_count;
        sVar5 = image[1].height;
        sVar8 = image[1].width;
        sVar7 = 0;
        do {
          fVar15 = *(float *)(sVar8 + sVar12 + sVar7 * 4);
          fVar16 = *(float *)(sVar5 + sVar12 + sVar7 * 4);
          fVar17 = *(float *)(sVar4 + sVar12 + sVar7 * 4);
          fVar18 = *(float *)(sVar3 + sVar12 + sVar7 * 4);
          if (fVar15 <= 0.0) {
            fVar15 = 0.0;
          }
          if (1.0 <= fVar15) {
            fVar15 = 1.0;
          }
          *(char *)(lVar10 + -3 + sVar7 * 4) = (char)(int)(fVar15 * 255.0);
          if (fVar16 <= 0.0) {
            fVar16 = 0.0;
          }
          if (1.0 <= fVar16) {
            fVar16 = 1.0;
          }
          *(char *)(lVar10 + -2 + sVar7 * 4) = (char)(int)(fVar16 * 255.0);
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          if (1.0 <= fVar17) {
            fVar17 = 1.0;
          }
          *(char *)(lVar10 + -1 + sVar7 * 4) = (char)(int)(fVar17 * 255.0);
          if (fVar18 <= 0.0) {
            fVar18 = 0.0;
          }
          if (1.0 <= fVar18) {
            fVar18 = 1.0;
          }
          *(char *)(lVar10 + sVar7 * 4) = (char)(int)(fVar18 * 255.0);
          sVar7 = sVar7 + 1;
        } while (sVar2 != sVar7);
      }
      sVar9 = sVar9 + 1;
      puVar13 = puVar13 + lVar11;
      sVar12 = sVar12 + local_38;
      lVar10 = lVar10 + lVar11;
    } while (sVar9 != local_48);
  }
  png_write_image(png_ptr,local_40);
  free(__ptr);
  free(local_50);
  png_write_end(png_ptr,info_ptr);
  png_destroy_write_struct(&png_ptr,&info_ptr);
  return true;
}

Assistant:

static bool save_png_image_to_file(FILE* fp, const struct image* image) {
    assert(is_rgb_or_rgba_image(image));

    png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    if (!png_ptr)
        return false;

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        png_destroy_read_struct(&png_ptr, NULL, NULL);
        return false;
    }

    png_byte** row_ptrs = NULL;
    png_byte* row_bytes = NULL;
    if (setjmp(png_jmpbuf(png_ptr))) {
        if (row_ptrs)  free(row_ptrs);
        if (row_bytes) free(row_bytes);
        png_destroy_write_struct(&png_ptr, &info_ptr);
        return false;
    }

    png_init_io(png_ptr, fp);
    png_set_IHDR(
        png_ptr, info_ptr,
        image->width, image->height, 8,
        image->channel_count == 3 ? PNG_COLOR_TYPE_RGB : PNG_COLOR_TYPE_RGBA,
        PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);
    png_write_info(png_ptr, info_ptr);

    bool has_alpha = image->channel_count >= 4;
    size_t stride = image->width * image->channel_count;
    row_ptrs  = xmalloc(sizeof(png_byte*) * image->height);
    row_bytes = xmalloc(sizeof(png_byte) * stride * image->height);
    for (size_t i = 0, n = image->height; i < n; ++i) {
        row_ptrs[i] = row_bytes + stride * i;
        png_byte* row = row_bytes + stride * i;
        if (has_alpha) {
            for (size_t j = 0, m = image->width; j < m; ++j) {
                struct rgba pixel = get_rgba_pixel(image, j, i);
                row[j * 4 + 0] = clamp_real(pixel.r, 0, 1) * (real_t)255;
                row[j * 4 + 1] = clamp_real(pixel.g, 0, 1) * (real_t)255;
                row[j * 4 + 2] = clamp_real(pixel.b, 0, 1) * (real_t)255;
                row[j * 4 + 3] = clamp_real(pixel.a, 0, 1) * (real_t)255;
            }
        } else {
            for (size_t j = 0, m = image->width; j < m; ++j) {
                struct rgb pixel = get_rgb_pixel(image, j, i);
                row[j * 3 + 0] = clamp_real(pixel.r, 0, 1) * (real_t)255;
                row[j * 3 + 1] = clamp_real(pixel.g, 0, 1) * (real_t)255;
                row[j * 3 + 2] = clamp_real(pixel.b, 0, 1) * (real_t)255;
            }
        }
    }
    png_write_image(png_ptr, row_ptrs);
    free(row_ptrs);
    free(row_bytes);
    row_ptrs = NULL;
    row_bytes = NULL;

    png_write_end(png_ptr, info_ptr);
    png_destroy_write_struct(&png_ptr, &info_ptr);
    return true;
}